

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

char * path_encode(char *path)

{
  uint uVar1;
  size_t sVar2;
  ushort **ppuVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  sVar2 = strlen(path);
  uVar7 = 0;
  if (0 < (int)(uint)sVar2) {
    lVar5 = 0;
    do {
      bVar4 = path[lVar5];
      uVar6 = (uint)uVar7;
      if (((bVar4 - 0x2e < 0x32) && ((0x2000000000003U >> ((ulong)(bVar4 - 0x2e) & 0x3f) & 1) != 0))
         || (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(char)bVar4] & 8) != 0)) {
        bVar8 = true;
        if (uVar6 < 0xfff) {
          uVar1 = uVar6 + 1;
LAB_001aac2b:
          path_encode::temp[uVar7] = bVar4;
          bVar8 = false;
          uVar7 = (ulong)uVar1;
        }
      }
      else {
        bVar8 = true;
        if (uVar6 < 0xffd) {
          path_encode::temp[uVar7] = '-';
          path_encode::temp[uVar7 + 1] = "0123456789ABCDEF"[bVar4 >> 4];
          bVar4 = "0123456789ABCDEF"[bVar4 & 0xf];
          uVar1 = uVar6 + 3;
          uVar7 = (ulong)(uVar6 + 2);
          goto LAB_001aac2b;
        }
      }
    } while ((!bVar8) &&
            (bVar8 = (ulong)((uint)sVar2 & 0x7fffffff) - 1 != lVar5, lVar5 = lVar5 + 1, bVar8));
    uVar7 = (ulong)(int)uVar7;
  }
  path_encode::temp[uVar7] = '\0';
  return path_encode::temp;
}

Assistant:

static const char *path_encode(const char *path)
{
	static char temp[FILENAME_MAX];
	int i, pos = 0;
	int path_len = (int)strlen(path);
	for (i = 0; i < path_len; ++i) {
		int ch = path[i];
		if (valid_path_char(ch)) {
			if (pos >= sizeof(temp) - 1)
				break;

			temp[pos++] = (char)ch;
		} else {
			if (pos >= sizeof(temp) - 3)
				break;

			temp[pos++] = '-';
			temp[pos++] = "0123456789ABCDEF"[(ch >> 4) & 0xF];
			temp[pos++] = "0123456789ABCDEF"[ch & 0xF];
		}
	}

	temp[pos] = '\0';
	return temp;
}